

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::DefineUncachedFunctions(ByteCodeGenerator *this,FuncInfo *funcInfoParent)

{
  anon_class_16_2_0723c1d7 fn;
  anon_class_16_2_0723c1d7 defineCheck;
  ParseNode *pnodeParent;
  FuncInfo *funcInfoParent_local;
  ByteCodeGenerator *this_local;
  
  fn.funcInfoParent = (FuncInfo **)&pnodeParent;
  fn.this = this;
  pnodeParent = (ParseNode *)funcInfoParent;
  funcInfoParent_local = (FuncInfo *)this;
  MapContainerScopeFunctions<ByteCodeGenerator::DefineUncachedFunctions(FuncInfo*)::__0>
            (&funcInfoParent->root->super_ParseNode,fn);
  return;
}

Assistant:

void ByteCodeGenerator::DefineUncachedFunctions(FuncInfo *funcInfoParent)
{
    ParseNode *pnodeParent = funcInfoParent->root;
    auto defineCheck = [&](ParseNode *pnodeFnc)
    {
        Assert(pnodeFnc->nop == knopFncDecl);

        //
        // Don't define the function upfront in following cases
        // 1. x = function() {...};
        //    Don't define the function for all modes.
        //    Such a function can only be accessed via the LHS, so we define it at the assignment point
        //    rather than the scope entry to save a register (and possibly save the whole definition).
        //
        // 2. x = function f() {...};
        //    f is not visible in the enclosing scope.
        //    Such function expressions should be emitted only at the assignment point, as can be used only
        //    after the assignment. Might save register.
        //

        if (pnodeFnc->AsParseNodeFnc()->IsDeclaration() || pnodeFnc->AsParseNodeFnc()->IsDefaultModuleExport())
        {
            this->DefineOneFunction(pnodeFnc->AsParseNodeFnc(), funcInfoParent);
            // The "x = function() {...}" case is being generated on the fly, during emission,
            // so the caller expects to be able to release this register.
            funcInfoParent->ReleaseLoc(pnodeFnc);
            pnodeFnc->location = Js::Constants::NoRegister;
        }
    };
    MapContainerScopeFunctions(pnodeParent, defineCheck);
}